

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cwd-and-chdir.c
# Opt level: O0

int run_test_cwd_and_chdir(void)

{
  int iVar1;
  size_t sStack_818;
  int err;
  size_t size2;
  size_t size1;
  char buffer_new [1024];
  char buffer_orig [1024];
  
  size2 = 1;
  iVar1 = uv_cwd(buffer_new + 0x3f8,&size2);
  if (iVar1 != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x26,"err == UV_ENOBUFS");
    abort();
  }
  if (size2 < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x27,"size1 > 1");
    abort();
  }
  size2 = 0x400;
  iVar1 = uv_cwd(buffer_new + 0x3f8,&size2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x2b,"err == 0");
    abort();
  }
  if (size2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x2c,"size1 > 0");
    abort();
  }
  if (buffer_new[size2 + 0x3f8] == '/') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x2d,"buffer_orig[size1] != \'/\'");
    abort();
  }
  iVar1 = uv_chdir(buffer_new + 0x3f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x30,"err == 0");
    abort();
  }
  sStack_818 = 0x400;
  iVar1 = uv_cwd(&size1,&stack0xfffffffffffff7e8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x34,"err == 0");
    abort();
  }
  if (size2 != sStack_818) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x36,"size1 == size2");
    abort();
  }
  iVar1 = strcmp(buffer_new + 0x3f8,(char *)&size1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
            ,0x37,"strcmp(buffer_orig, buffer_new) == 0");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(cwd_and_chdir) {
  char buffer_orig[PATHMAX];
  char buffer_new[PATHMAX];
  size_t size1;
  size_t size2;
  int err;

  size1 = 1;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == UV_ENOBUFS);
  ASSERT(size1 > 1);

  size1 = sizeof buffer_orig;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == 0);
  ASSERT(size1 > 0);
  ASSERT(buffer_orig[size1] != '/');

  err = uv_chdir(buffer_orig);
  ASSERT(err == 0);

  size2 = sizeof buffer_new;
  err = uv_cwd(buffer_new, &size2);
  ASSERT(err == 0);

  ASSERT(size1 == size2);
  ASSERT(strcmp(buffer_orig, buffer_new) == 0);

  return 0;
}